

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

int lookupid(char *data,size_t length,name_entry_t *table,size_t count)

{
  void *pvVar1;
  name_entry_t *entry;
  char local_48 [4];
  int i;
  char name [20];
  size_t count_local;
  name_entry_t *table_local;
  size_t length_local;
  char *data_local;
  
  if (length < 0x14) {
    unique0x10000082 = count;
    for (entry._4_4_ = 0; (ulong)(long)entry._4_4_ < length; entry._4_4_ = entry._4_4_ + 1) {
      local_48[entry._4_4_] = data[entry._4_4_];
    }
    local_48[length] = '\0';
    pvVar1 = bsearch(local_48,table,stack0xffffffffffffffd0 >> 4,0x10,name_entry_compare);
    if (pvVar1 == (void *)0x0) {
      data_local._4_4_ = 0;
    }
    else {
      data_local._4_4_ = *(int *)((long)pvVar1 + 8);
    }
  }
  else {
    data_local._4_4_ = 0;
  }
  return data_local._4_4_;
}

Assistant:

static int lookupid(const char* data, size_t length, const name_entry_t* table, size_t count)
{
    if(length > MAX_NAME)
        return 0;
    char name[MAX_NAME + 1];
    for(int i = 0; i < length; i++)
        name[i] = data[i];
    name[length] = '\0';

    name_entry_t* entry = bsearch(name, table, count / sizeof(name_entry_t), sizeof(name_entry_t), name_entry_compare);
    if(entry == NULL)
        return 0;
    return entry->id;
}